

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int32_t ffi_checkint(lua_State *L,int narg)

{
  lua_State *L_00;
  int in_ESI;
  long in_RDI;
  int32_t i;
  TValue *o;
  CTState *cts;
  undefined4 in_stack_00000018;
  CTState *cts_1;
  ErrMsg in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  
  *(long *)((ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x194) + 0x10) = in_RDI;
  L_00 = (lua_State *)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 8 + -8);
  if (*(lua_State **)(in_RDI + 0x18) <= L_00) {
    lj_err_arg(L_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  lj_cconv_ct_tv((CTState *)L,(CType *)CONCAT44(narg,in_stack_00000018),(uint8_t *)cts,o,i);
  return in_stack_ffffffffffffffac;
}

Assistant:

static int32_t ffi_checkint(lua_State *L, int narg)
{
  CTState *cts = ctype_cts(L);
  TValue *o = L->base + narg-1;
  int32_t i;
  if (o >= L->top)
    lj_err_arg(L, narg, LJ_ERR_NOVAL);
  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o,
		 CCF_ARG(narg));
  return i;
}